

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

bool IR::Instr::OpndHasAnyImplicitCalls(Opnd *opnd,bool isSrc)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  undefined4 *puVar4;
  long lVar5;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a;
  
  if (opnd != (Opnd *)0x0) {
    OVar2 = Opnd::GetKind(opnd);
    if (OVar2 == OpndKindSym) {
      OVar2 = Opnd::GetKind(opnd);
      if (OVar2 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar3) goto LAB_004bab0f;
        *puVar4 = 0;
      }
      if (*(char *)((long)opnd[1]._vptr_Opnd + 0x14) == '\x02') {
        return true;
      }
    }
    OVar2 = Opnd::GetKind(opnd);
    if (OVar2 == OpndKindIndir) {
      return true;
    }
    if (isSrc) {
      local_2a = (opnd->m_valueType).field_0;
      bVar3 = ValueType::IsPrimitive((ValueType *)&local_2a.field_0);
      if (!bVar3) {
        return true;
      }
    }
    OVar2 = Opnd::GetKind(opnd);
    if (OVar2 == OpndKindList) {
      OVar2 = Opnd::GetKind(opnd);
      if (OVar2 != OpndKindList) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1a4,"(this->IsListOpnd())","Bad call to AsListOpnd()");
        if (!bVar3) {
LAB_004bab0f:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      if (0 < *(int *)&opnd[1]._vptr_Opnd) {
        lVar5 = 0;
        do {
          bVar3 = OpndHasAnyImplicitCalls
                            (*(Opnd **)(*(long *)&opnd[1].m_valueType + lVar5 * 8),isSrc);
          if (bVar3) {
            return bVar3;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < *(int *)&opnd[1]._vptr_Opnd);
        return bVar3;
      }
    }
  }
  return false;
}

Assistant:

bool Instr::OpndHasAnyImplicitCalls(IR::Opnd* opnd, bool isSrc)
{
    return opnd && (
        (opnd->IsSymOpnd() && opnd->AsSymOpnd()->m_sym->IsPropertySym()) ||
        opnd->IsIndirOpnd() ||
        (isSrc && !opnd->GetValueType().IsPrimitive()) ||
        (opnd->IsListOpnd() && opnd->AsListOpnd()->Any([isSrc](IR::Opnd* lOpnd) { return OpndHasAnyImplicitCalls(lOpnd, isSrc); }))
    );
}